

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O2

void png_read_image(png_structrp png_ptr,png_bytepp image)

{
  png_uint_32 pVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (png_ptr != (png_structrp)0x0) {
    if ((png_ptr->flags & 0x40) == 0) {
      iVar2 = png_set_interlace_handling(png_ptr);
      png_start_read_image(png_ptr);
    }
    else {
      if ((png_ptr->interlaced != '\0') && ((png_ptr->transformations & 2) == 0)) {
        png_warning(png_ptr,"Interlace handling should be turned on when using png_read_image");
        png_ptr->num_rows = png_ptr->height;
      }
      iVar2 = png_set_interlace_handling(png_ptr);
    }
    pVar1 = png_ptr->height;
    iVar3 = 0;
    if (iVar2 < 1) {
      iVar2 = iVar3;
    }
    for (; iVar3 != iVar2; iVar3 = iVar3 + 1) {
      for (lVar4 = 0; pVar1 != (png_uint_32)lVar4; lVar4 = lVar4 + 1) {
        png_read_row(png_ptr,image[lVar4],(png_bytep)0x0);
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_read_image(png_structrp png_ptr, png_bytepp image)
{
   png_uint_32 i, image_height;
   int pass, j;
   png_bytepp rp;

   png_debug(1, "in png_read_image");

   if (png_ptr == NULL)
      return;

#ifdef PNG_READ_INTERLACING_SUPPORTED
   if ((png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
   {
      pass = png_set_interlace_handling(png_ptr);
      /* And make sure transforms are initialized. */
      png_start_read_image(png_ptr);
   }
   else
   {
      if (png_ptr->interlaced != 0 &&
          (png_ptr->transformations & PNG_INTERLACE) == 0)
      {
         /* Caller called png_start_read_image or png_read_update_info without
          * first turning on the PNG_INTERLACE transform.  We can fix this here,
          * but the caller should do it!
          */
         png_warning(png_ptr, "Interlace handling should be turned on when "
             "using png_read_image");
         /* Make sure this is set correctly */
         png_ptr->num_rows = png_ptr->height;
      }

      /* Obtain the pass number, which also turns on the PNG_INTERLACE flag in
       * the above error case.
       */
      pass = png_set_interlace_handling(png_ptr);
   }
#else
   if (png_ptr->interlaced)
      png_error(png_ptr,
          "Cannot read interlaced image -- interlace handler disabled");

   pass = 1;
#endif

   image_height=png_ptr->height;

   for (j = 0; j < pass; j++)
   {
      rp = image;
      for (i = 0; i < image_height; i++)
      {
         png_read_row(png_ptr, *rp, NULL);
         rp++;
      }
   }
}